

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBoxPrivate::emitCurrentIndexChanged(QComboBoxPrivate *this,QModelIndex *index)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  QString local_a8;
  anon_union_24_3_e3d07ef4_for_data local_88;
  code *local_68;
  anon_union_24_3_e3d07ef4_for_data *local_60;
  QObject *pQStack_58;
  undefined1 *local_50;
  anon_union_24_3_e3d07ef4_for_data aStack_48;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  itemText(&local_a8,this,index);
  local_88._0_4_ = index->r;
  local_60 = &local_88;
  local_68 = (code *)0x0;
  QMetaObject::activate(pQVar1,&QComboBox::staticMetaObject,5,&local_68);
  if (this->lineEdit == (QLineEdit *)0x0) {
    updateCurrentText(this,&local_a8);
  }
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStack_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_60 = (anon_union_24_3_e3d07ef4_for_data *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_58 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_88,(QString *)&local_a8);
  local_60._0_4_ = 0x80c1;
  local_50 = (undefined1 *)CONCAT44(local_50._4_4_,0xffffffff);
  local_68 = QTextDocument::setMarkdown;
  pQStack_58 = pQVar1;
  ::QVariant::QVariant((QVariant *)&aStack_48,(QVariant *)&local_88);
  local_60 = (anon_union_24_3_e3d07ef4_for_data *)CONCAT44(local_60._4_4_,0x800e);
  ::QVariant::~QVariant((QVariant *)&local_88);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_68);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::emitCurrentIndexChanged(const QModelIndex &index)
{
    Q_Q(QComboBox);
    const QString text = itemText(index);
    emit q->currentIndexChanged(index.row());
    // signal lineEdit.textChanged already connected to signal currentTextChanged, so don't emit double here
    if (!lineEdit)
        updateCurrentText(text);
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(q, text);
    QAccessible::updateAccessibility(&event);
#endif
}